

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

void __thiscall UnifiedRegex::Matcher::PopStats(Matcher *this,ContStack *contStack,Char *input)

{
  uint64 *puVar1;
  Cont *pCVar2;
  
  if (this->stats != (Type)0x0) {
    puVar1 = &this->stats->numPops;
    *puVar1 = *puVar1 + 1;
  }
  if (this->w != (Type)0x0) {
    pCVar2 = ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::Top
                       (&contStack->
                         super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    if (pCVar2 != (Cont *)0x0) {
      DebugWriter::Print(this->w,L"POP ");
      (**pCVar2->_vptr_Cont)(pCVar2,this->w,input);
      return;
    }
    DebugWriter::PrintEOL(this->w,L"<empty stack>");
    return;
  }
  return;
}

Assistant:

void Matcher::PopStats(ContStack& contStack, const Char* const input) const
    {
        if (stats != 0)
        {
            stats->numPops++;
        }
        if (w != 0)
        {
            const Cont* top = contStack.Top();
            if (top == 0)
                w->PrintEOL(_u("<empty stack>"));
            else
            {
                w->Print(_u("POP "));
                top->Print(w, input);
            }
        }
    }